

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bilinear_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar13;
  long *in_RDI;
  __m128 _v;
  __m128 value2;
  __m128 v1;
  __m128 v0;
  __m128 value1;
  __m128 v11_val;
  __m128 v10_val;
  __m128 v01_val;
  __m128 v00_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_63c;
  int *local_5f0;
  undefined8 *local_5a0;
  int local_544;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  lVar10 = in_RSI[7];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar11 = in_RSI[6];
  for (local_544 = 0; local_544 < (int)lVar10; local_544 = local_544 + 1) {
    lVar13 = *in_RDI + in_RDI[8] * (long)local_544 * in_RDI[2];
    local_5a0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_544 * in_RSI[2]);
    local_5f0 = (int *)*in_RDX;
    for (local_63c = 0; local_63c < iVar3 * (int)lVar11; local_63c = local_63c + 1) {
      if (*local_5f0 < 0) {
        local_7a8 = 0;
        uStack_7a0 = 0;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)*local_5f0 * 4);
        local_7a8 = *puVar12;
        uStack_7a0 = puVar12[1];
      }
      if (local_5f0[1] < 0) {
        local_7b8 = 0;
        uStack_7b0 = 0;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_5f0[1] * 4);
        local_7b8 = *puVar12;
        uStack_7b0 = puVar12[1];
      }
      if (local_5f0[2] < 0) {
        local_7c8 = 0;
        uStack_7c0 = 0;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_5f0[2] * 4);
        local_7c8 = *puVar12;
        uStack_7c0 = puVar12[1];
      }
      if (local_5f0[3] < 0) {
        local_7d8 = 0;
        uStack_7d0 = 0;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_5f0[3] * 4);
        local_7d8 = *puVar12;
        uStack_7d0 = puVar12[1];
      }
      fVar1 = (float)local_5f0[4];
      auVar9._8_8_ = uStack_7a0;
      auVar9._0_8_ = local_7a8;
      local_118 = (float)local_7a8;
      fStack_114 = (float)((ulong)local_7a8 >> 0x20);
      fStack_110 = (float)uStack_7a0;
      fStack_10c = (float)((ulong)uStack_7a0 >> 0x20);
      auVar4._4_4_ = fStack_114 * fVar1;
      auVar4._0_4_ = local_118 * fVar1;
      auVar4._8_4_ = fStack_110 * fVar1;
      auVar4._12_4_ = fStack_10c * fVar1;
      auVar4 = vsubps_avx(auVar9,auVar4);
      local_b8 = (float)local_7b8;
      fStack_b4 = (float)((ulong)local_7b8 >> 0x20);
      fStack_b0 = (float)uStack_7b0;
      fStack_ac = (float)((ulong)uStack_7b0 >> 0x20);
      local_188 = auVar4._0_4_;
      fStack_184 = auVar4._4_4_;
      fStack_180 = auVar4._8_4_;
      fStack_17c = auVar4._12_4_;
      local_188 = local_b8 * fVar1 + local_188;
      fStack_184 = fStack_b4 * fVar1 + fStack_184;
      fStack_180 = fStack_b0 * fVar1 + fStack_180;
      fStack_17c = fStack_ac * fVar1 + fStack_17c;
      auVar8._8_8_ = uStack_7c0;
      auVar8._0_8_ = local_7c8;
      local_f8 = (float)local_7c8;
      fStack_f4 = (float)((ulong)local_7c8 >> 0x20);
      fStack_f0 = (float)uStack_7c0;
      fStack_ec = (float)((ulong)uStack_7c0 >> 0x20);
      auVar5._4_4_ = fStack_f4 * fVar1;
      auVar5._0_4_ = local_f8 * fVar1;
      auVar5._8_4_ = fStack_f0 * fVar1;
      auVar5._12_4_ = fStack_ec * fVar1;
      auVar4 = vsubps_avx(auVar8,auVar5);
      local_98 = (float)local_7d8;
      fStack_94 = (float)((ulong)local_7d8 >> 0x20);
      fStack_90 = (float)uStack_7d0;
      fStack_8c = (float)((ulong)uStack_7d0 >> 0x20);
      local_168 = auVar4._0_4_;
      fStack_164 = auVar4._4_4_;
      fStack_160 = auVar4._8_4_;
      fStack_15c = auVar4._12_4_;
      fVar2 = (float)local_5f0[5];
      auVar7._4_4_ = fStack_184;
      auVar7._0_4_ = local_188;
      auVar7._8_4_ = fStack_180;
      auVar7._12_4_ = fStack_17c;
      auVar6._4_4_ = fStack_184 * fVar2;
      auVar6._0_4_ = local_188 * fVar2;
      auVar6._8_4_ = fStack_180 * fVar2;
      auVar6._12_4_ = fStack_17c * fVar2;
      auVar4 = vsubps_avx(auVar7,auVar6);
      local_148 = auVar4._0_4_;
      fStack_144 = auVar4._4_4_;
      fStack_140 = auVar4._8_4_;
      fStack_13c = auVar4._12_4_;
      *local_5a0 = CONCAT44((fStack_94 * fVar1 + fStack_164) * fVar2 + fStack_144,
                            (local_98 * fVar1 + local_168) * fVar2 + local_148);
      local_5a0[1] = CONCAT44((fStack_8c * fVar1 + fStack_15c) * fVar2 + fStack_13c,
                              (fStack_90 * fVar1 + fStack_160) * fVar2 + fStack_140);
      local_5a0 = local_5a0 + 2;
      local_5f0 = local_5f0 + 6;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            __m128 v00_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            __m128 v01_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
            __m128 v10_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
            __m128 v11_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

            __m128 value1 = _mm_set1_ps(value_ptr[0]);
            __m128 v0 = _mm_comp_fmadd_ps(v01_val, value1, _mm_comp_fnmadd_ps(v00_val, value1, v00_val));
            __m128 v1 = _mm_comp_fmadd_ps(v11_val, value1, _mm_comp_fnmadd_ps(v10_val, value1, v10_val));

            __m128 value2 = _mm_set1_ps(value_ptr[1]);
            __m128 _v = _mm_comp_fmadd_ps(v1, value2, _mm_comp_fnmadd_ps(v0, value2, v0));
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 6;
        }
    }
}